

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateInitializingEntryCallback
               (HelicsFederate fed,_func_void_HelicsBool_void_ptr *initializingEntry,void *userdata,
               HelicsError *err)

{
  Federate *pFVar1;
  Federate *in_RDX;
  function<void_(bool)> *in_RSI;
  Federate *fedptr;
  function<void_(bool)> *in_stack_ffffffffffffff60;
  HelicsError *in_stack_ffffffffffffff68;
  function<void_(bool)> *in_stack_ffffffffffffff70;
  function<void_(bool)> *in_stack_ffffffffffffff78;
  Federate *in_stack_ffffffffffffff80;
  
  pFVar1 = getFed(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (pFVar1 != (Federate *)0x0) {
    if (in_RSI == (function<void_(bool)> *)0x0) {
      std::function<void_(bool)>::function(in_stack_ffffffffffffff60);
      helics::Federate::setInitializingEntryCallback
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      std::function<void_(bool)>::~function((function<void_(bool)> *)0x1bd056);
    }
    else {
      std::function<void(bool)>::function<helicsFederateInitializingEntryCallback::__0,void>
                (in_stack_ffffffffffffff70,(anon_class_16_2_35e3f327 *)in_stack_ffffffffffffff68);
      helics::Federate::setInitializingEntryCallback(in_RDX,in_RSI);
      std::function<void_(bool)>::~function((function<void_(bool)> *)0x1bd0c9);
    }
  }
  return;
}

Assistant:

void helicsFederateInitializingEntryCallback(HelicsFederate fed,
                                             void (*initializingEntry)(HelicsBool iterating, void* userdata),
                                             void* userdata,
                                             HelicsError* err)
{
    auto* fedptr = getFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (initializingEntry == nullptr) {
            fedptr->setInitializingEntryCallback({});
        } else {
            fedptr->setInitializingEntryCallback(
                [initializingEntry, userdata](bool iterating) { initializingEntry(iterating ? HELICS_TRUE : HELICS_FALSE, userdata); });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}